

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFunctions.h
# Opt level: O0

bool CreateDirectory<char>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dirname)

{
  int iVar1;
  char *__path;
  string local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dirname_local;
  
  local_18 = dirname;
  ToString<char>(&local_38,dirname);
  __path = (char *)std::__cxx11::string::c_str();
  iVar1 = mkdir(__path,0x1ed);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar1 == 0;
}

Assistant:

bool CreateDirectory(const std::basic_string<T>& dirname)
{
#ifdef _WIN32
    if (!CreateDirectory(ToTString(dirname).c_str(), NULL))
        return false;
#endif
#ifdef _UNIX
    if (mkdir(ToString(dirname).c_str(), 0755))
        return false;
#endif
    return true;
}